

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void store_coding_context(MACROBLOCK *x,PICK_MODE_CONTEXT *ctx,int skippable)

{
  uint8_t ref_frame_type;
  
  (ctx->rd_stats).skip_txfm = (x->txfm_search_info).skip_txfm;
  ctx->skippable = skippable;
  memcpy(ctx,*(x->e_mbd).mi,0xb0);
  ref_frame_type = av1_ref_frame_type((*(x->e_mbd).mi)->ref_frame);
  av1_copy_mbmi_ext_to_mbmi_ext_frame(&ctx->mbmi_ext_best,&x->mbmi_ext,ref_frame_type);
  return;
}

Assistant:

static inline void store_coding_context(
#if CONFIG_INTERNAL_STATS
    MACROBLOCK *x, PICK_MODE_CONTEXT *ctx, int mode_index,
#else
    MACROBLOCK *x, PICK_MODE_CONTEXT *ctx,
#endif  // CONFIG_INTERNAL_STATS
    int skippable) {
  MACROBLOCKD *const xd = &x->e_mbd;

  // Take a snapshot of the coding context so it can be
  // restored if we decide to encode this way
  ctx->rd_stats.skip_txfm = x->txfm_search_info.skip_txfm;
  ctx->skippable = skippable;
#if CONFIG_INTERNAL_STATS
  ctx->best_mode_index = mode_index;
#endif  // CONFIG_INTERNAL_STATS
  ctx->mic = *xd->mi[0];
  av1_copy_mbmi_ext_to_mbmi_ext_frame(&ctx->mbmi_ext_best, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
}